

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::init
          (ShaderTextureFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  Vec4 *b_00;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  EVP_PKEY_CTX *ctx_00;
  Vec4 s;
  float lodCoordTrans [16];
  Vec4 b;
  int numVertexUnits;
  
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
    numVertexUnits = 0;
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8b4c,&numVertexUnits);
    if (numVertexUnits < 1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)lodCoordTrans,"Vertex shader texture access is not supported",
                 (allocator<char> *)&s);
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)lodCoordTrans);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  b_00 = &(this->m_lookupSpec).minCoord;
  tcu::operator-((tcu *)&s,&(this->m_lookupSpec).maxCoord,b_00);
  tcu::Vector<float,_4>::Vector(&b,b_00);
  lodCoordTrans[0] = s.m_data[0];
  lodCoordTrans[1] = 0.0;
  lodCoordTrans[2] = 0.0;
  lodCoordTrans[3] = b.m_data[0];
  lodCoordTrans._16_8_ = (ulong)(uint)s.m_data[1] << 0x20;
  lodCoordTrans._24_8_ = (ulong)(uint)b.m_data[1] << 0x20;
  lodCoordTrans[8] = s.m_data[2] * 0.5;
  lodCoordTrans[9] = s.m_data[2] * -0.5;
  lodCoordTrans._40_8_ = (ulong)(uint)(lodCoordTrans[8] + b.m_data[2]) << 0x20;
  lodCoordTrans[0xc] = s.m_data[3] * -0.5;
  lodCoordTrans[0xd] = s.m_data[3] * 0.5;
  lodCoordTrans._56_8_ = (ulong)(uint)(lodCoordTrans[0xd] + b.m_data[3]) << 0x20;
  this_00 = &(this->super_ShaderRenderCase).m_userAttribTransforms;
  ctx_00 = (EVP_PKEY_CTX *)&numVertexUnits;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,lodCoordTrans);
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)ctx_00);
  if (((this->m_lookupSpec).function - FUNCTION_TEXTURELOD < 3) ||
     ((this->m_lookupSpec).useBias == true)) {
    lodCoordTrans[3] = (this->m_lookupSpec).minLodBias;
    lodCoordTrans[2] = 0.0;
    lodCoordTrans[0xc] = 0.0;
    lodCoordTrans[0xd] = 0.0;
    lodCoordTrans[0xe] = 0.0;
    lodCoordTrans[0xf] = 0.0;
    lodCoordTrans[8] = 0.0;
    lodCoordTrans[9] = 0.0;
    lodCoordTrans[10] = 0.0;
    lodCoordTrans[0xb] = 0.0;
    lodCoordTrans[0] = ((this->m_lookupSpec).maxLodBias - lodCoordTrans[3]) * 0.5;
    lodCoordTrans[4] = 0.0;
    lodCoordTrans[5] = 0.0;
    lodCoordTrans[6] = 0.0;
    lodCoordTrans[7] = 0.0;
    ctx_00 = (EVP_PKEY_CTX *)&numVertexUnits;
    lodCoordTrans[1] = lodCoordTrans[0];
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,lodCoordTrans);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)ctx_00);
  }
  initShaderSources(this);
  initTexture(this);
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  return iVar1;
}

Assistant:

void ShaderTextureFunctionCase::init (void)
{
	if (m_isVertexCase)
	{
		const glw::Functions& gl = m_renderCtx.getFunctions();
		int numVertexUnits = 0;
		gl.getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &numVertexUnits);
		if (numVertexUnits < 1)
			throw tcu::NotSupportedError("Vertex shader texture access is not supported");
	}

	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));
	}

	if (functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));
	}

	initShaderSources();
	initTexture();

	gls::ShaderRenderCase::init();
}